

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O3

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmCommand *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  cmState *this_01;
  cmGlobalGenerator *pcVar8;
  long *plVar9;
  long lVar10;
  ostream *poVar11;
  cmTarget *pcVar12;
  size_type *psVar13;
  pointer name;
  TargetType TVar14;
  pointer name_00;
  string libType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  string local_218;
  string local_1f8;
  uint local_1d0;
  uint local_1cc;
  cmCommand *local_1c8;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  undefined1 local_1b0 [112];
  ios_base local_140 [264];
  pointer local_38;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1b0);
    goto LAB_00296479;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"BUILD_SHARED_LIBS","");
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1b0);
  bVar3 = cmSystemTools::IsOff(pcVar6);
  local_1c8 = &this->super_cmCommand;
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  TVar14 = SHARED_LIBRARY - bVar3;
  local_38 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  name_00 = local_38 + 1;
  local_1b8 = 0;
  local_1d0 = 0;
  local_1cc = 0;
  local_1b4 = 0;
  local_1bc = 0;
  do {
    if (name_00 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_002963b2;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    pcVar2 = (name_00->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar2,pcVar2 + name_00->_M_string_length);
    uVar7 = std::__cxx11::string::compare((char *)&local_218);
    if ((int)uVar7 == 0) {
      if (TVar14 != INTERFACE_LIBRARY) {
        TVar14 = STATIC_LIBRARY;
LAB_0029618e:
        name_00 = name_00 + 1;
        iVar5 = 0;
        local_1cc = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
        goto LAB_0029627f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"INTERFACE library specified with conflicting STATIC type.",
                 0x39);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(local_1c8,&local_1f8);
LAB_0029623c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      TVar14 = INTERFACE_LIBRARY;
LAB_0029627a:
      iVar5 = 1;
    }
    else {
      uVar7 = std::__cxx11::string::compare((char *)&local_218);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = SHARED_LIBRARY;
          goto LAB_0029618e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"INTERFACE library specified with conflicting SHARED type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1c8,&local_1f8);
        goto LAB_0029623c;
      }
      uVar7 = std::__cxx11::string::compare((char *)&local_218);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = MODULE_LIBRARY;
          goto LAB_0029618e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"INTERFACE library specified with conflicting MODULE type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1c8,&local_1f8);
        goto LAB_0029623c;
      }
      uVar7 = std::__cxx11::string::compare((char *)&local_218);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = OBJECT_LIBRARY;
          goto LAB_0029618e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"INTERFACE library specified with conflicting OBJECT type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1c8,&local_1f8);
        goto LAB_0029623c;
      }
      uVar7 = std::__cxx11::string::compare((char *)&local_218);
      if ((int)uVar7 == 0) {
        if (TVar14 != INTERFACE_LIBRARY) {
          TVar14 = UNKNOWN_LIBRARY;
          goto LAB_0029618e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"INTERFACE library specified with conflicting UNKNOWN type."
                   ,0x3a);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1c8,&local_1f8);
        goto LAB_0029623c;
      }
      uVar7 = std::__cxx11::string::compare((char *)&local_218);
      if ((int)uVar7 != 0) {
        uVar7 = std::__cxx11::string::compare((char *)&local_218);
        if ((int)uVar7 != 0) {
          uVar7 = std::__cxx11::string::compare((char *)name_00);
          if ((int)uVar7 == 0) {
            if (TVar14 == INTERFACE_LIBRARY) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,
                         "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(local_1c8,&local_1f8);
              goto LAB_0029623c;
            }
            name_00 = name_00 + 1;
            local_1bc = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
            iVar5 = 0;
          }
          else {
            uVar7 = std::__cxx11::string::compare((char *)name_00);
            if ((int)uVar7 == 0) {
              name_00 = name_00 + 1;
              iVar5 = 0;
              local_1d0 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
            else if (((local_1d0 & 1) == 0) ||
                    (uVar7 = std::__cxx11::string::compare((char *)name_00), (int)uVar7 != 0)) {
              iVar5 = 3;
              if (TVar14 == INTERFACE_LIBRARY) {
                iVar4 = std::__cxx11::string::compare((char *)name_00);
                TVar14 = INTERFACE_LIBRARY;
                if (iVar4 == 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,
                             "GLOBAL option may only be used with IMPORTED libraries.",0x37);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(local_1c8,&local_1f8);
                  goto LAB_0029634c;
                }
              }
            }
            else {
              name_00 = name_00 + 1;
              iVar5 = 0;
              local_1b8 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
          }
          goto LAB_0029627f;
        }
        if ((local_1cc & 1) == 0) {
          if ((local_1b4 & 1) == 0) {
            if ((local_1bc & 1) == 0) {
              TVar14 = INTERFACE_LIBRARY;
              goto LAB_0029618e;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1c8,&local_1f8);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "INTERFACE library specified with conflicting ALIAS type.",0x38);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1c8,&local_1f8);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,
                     "INTERFACE library specified with conflicting/multiple types.",0x3c);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1c8,&local_1f8);
        }
LAB_0029634c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        goto LAB_0029627a;
      }
      if (TVar14 == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"INTERFACE library specified with conflicting ALIAS type.",
                   0x38);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1c8,&local_1f8);
        goto LAB_0029623c;
      }
      name_00 = name_00 + 1;
      iVar5 = 0;
      local_1b4 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
LAB_0029627f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  } while (iVar5 == 0);
  if (iVar5 != 3) {
    return false;
  }
LAB_002963b2:
  name = local_38;
  this_00 = local_1c8;
  if (TVar14 == INTERFACE_LIBRARY) {
    if (name_00 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (((local_1b8 & 1) == 0) || ((local_1d0 & 1) != 0)) goto LAB_002964a4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"INTERFACE library specified as GLOBAL, but not as IMPORTED.",
                 0x3b);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_218);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"INTERFACE library requires no source arguments.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_218);
    }
LAB_00296412:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_00296428;
LAB_0029641b:
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
LAB_00296428:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
    return false;
  }
LAB_002964a4:
  bVar3 = cmGeneratorExpression::IsValidTargetName(local_38);
  if ((((!bVar3) || (bVar3 = cmGlobalGenerator::IsReservedTarget(name), bVar3)) ||
      (((local_1d0 & 1) == 0 &&
       (((local_1b4 & 1) == 0 &&
        (lVar10 = std::__cxx11::string::find((char)name,0x3a), lVar10 != -1)))))) &&
     (bVar3 = cmMakefile::CheckCMP0037(this_00->Makefile,name,TVar14), !bVar3)) {
    return false;
  }
  if ((local_1b4 & 1) == 0) {
    if (((local_1d0 & 1) != 0) && ((local_1bc & 1) != 0)) {
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"excludeFromAll with IMPORTED target makes no sense.","");
      cmCommand::SetError(this_00,(string *)local_1b0);
LAB_00296479:
      if ((undefined1 *)local_1b0._0_8_ == local_1b0 + 0x10) {
        return false;
      }
      goto LAB_00296483;
    }
    if ((TVar14 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
      this_01 = cmMakefile::GetState(this_00->Makefile);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"TARGET_SUPPORTS_SHARED_LIBS","");
      bVar3 = cmState::GetGlobalPropertyAsBool(this_01,(string *)local_1b0);
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
      }
      if (bVar3) goto LAB_00296606;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"ADD_LIBRARY called with ",0x18);
      pcVar6 = "MODULE";
      if (TVar14 == SHARED_LIBRARY) {
        pcVar6 = "SHARED";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar6,6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                 ,0x7f);
      pcVar1 = this_00->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      TVar14 = STATIC_LIBRARY;
      if ((local_1d0 & 1) != 0) goto LAB_002967f6;
    }
    else {
LAB_00296606:
      if ((local_1d0 & 1) != 0) {
LAB_002967f6:
        if ((local_1cc & 1) == 0) {
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"called with IMPORTED argument but no library type.","");
          cmCommand::SetError(this_00,(string *)local_1b0);
          goto LAB_00296479;
        }
        if (TVar14 == INTERFACE_LIBRARY) {
          bVar3 = cmGeneratorExpression::IsValidTargetName(name);
          if (bVar3) goto LAB_00296c9a;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"Invalid name for IMPORTED INTERFACE library target: ",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_00,&local_218);
        }
        else {
          if (TVar14 == OBJECT_LIBRARY) {
            local_1b0._0_8_ = local_1b0 + 0x10;
            local_1b0._8_8_ = 0;
            local_1b0[0x10] = '\0';
            pcVar8 = cmMakefile::GetGlobalGenerator(this_00->Makefile);
            iVar5 = (*pcVar8->_vptr_cmGlobalGenerator[0x25])(pcVar8,local_1b0);
            if ((char)iVar5 == '\0') {
              pcVar1 = this_00->Makefile;
              std::operator+(&local_1f8,
                             "The OBJECT library type may not be used for IMPORTED libraries",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b0);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_218.field_2._M_allocated_capacity = *psVar13;
                local_218.field_2._8_8_ = plVar9[3];
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              }
              else {
                local_218.field_2._M_allocated_capacity = *psVar13;
                local_218._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_218._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
              operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1
                             );
            }
            name = local_38;
            if ((char)iVar5 == '\0') {
              return true;
            }
          }
LAB_00296c9a:
          pcVar12 = cmMakefile::FindTargetToUse(this_00->Makefile,name,false);
          if (pcVar12 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget(this_00->Makefile,name,TVar14,(bool)((byte)local_1b8 & 1))
            ;
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"cannot create imported target \"",0x1f);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,(name->_M_dataplus)._M_p,name->_M_string_length)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" because another target with the same name already exists.",0x3b);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_00,&local_218);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_00296428;
        goto LAB_0029641b;
      }
      if (TVar14 == UNKNOWN_LIBRARY) {
        pcVar1 = this_00->Makefile;
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,
                   "The UNKNOWN library type may be used only for IMPORTED libraries.","");
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1b0);
        if ((undefined1 *)local_1b0._0_8_ == local_1b0 + 0x10) {
          return true;
        }
        operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
        return true;
      }
    }
    local_1b0._0_8_ = local_1b0 + 0x10;
    local_1b0._8_8_ = 0;
    local_1b0[0x10] = '\0';
    bVar3 = cmMakefile::EnforceUniqueName(this_00->Makefile,name,(string *)local_1b0,false);
    if (bVar3) {
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
      }
      local_1f8._M_dataplus._M_p = (pointer)0x0;
      local_1f8._M_string_length = 0;
      local_1f8.field_2._M_allocated_capacity = 0;
      if (TVar14 == INTERFACE_LIBRARY) {
        bVar3 = cmGeneratorExpression::IsValidTargetName(name);
        if ((!bVar3) || (lVar10 = std::__cxx11::string::find((char *)name,0x590e58,0), lVar10 != -1)
           ) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"Invalid name for INTERFACE library target: ",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_00,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
          std::ios_base::~ios_base(local_140);
          bVar3 = false;
          goto LAB_00296b58;
        }
        TVar14 = INTERFACE_LIBRARY;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,0
                   ,name_00,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish);
      }
      bVar3 = true;
      cmMakefile::AddLibrary
                (this_00->Makefile,name,TVar14,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1f8,(bool)((byte)local_1bc & 1));
LAB_00296b58:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1f8);
      return bVar3;
    }
    cmCommand::SetError(this_00,(string *)local_1b0);
  }
  else {
    bVar3 = cmGeneratorExpression::IsValidTargetName(name);
    if (bVar3) {
      if ((local_1bc & 1) == 0) {
        if (((local_1d0 & 1) == 0) && ((local_1b8 & 1) == 0)) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == 0x60) {
            bVar3 = cmMakefile::IsAlias(this_00->Makefile,name_00);
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,"cannot create ALIAS target \"",0x1c);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b0,(name->_M_dataplus)._M_p,
                                   name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" because target \"",0x12);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(name_00->_M_dataplus)._M_p,name_00->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" is itself an ALIAS.",0x15);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_00,&local_218);
            }
            else {
              pcVar12 = cmMakefile::FindTargetToUse(this_00->Makefile,name_00,true);
              if (pcVar12 == (cmTarget *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"cannot create ALIAS target \"",0x1c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,(name->_M_dataplus)._M_p,
                                     name->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" because target \"",0x12);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(name_00->_M_dataplus)._M_p,name_00->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" does not already exist.",0x19);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(this_00,&local_218);
              }
              else {
                TVar14 = cmTarget::GetType(pcVar12);
                if (((TVar14 - STATIC_LIBRARY < 4) || (TVar14 == INTERFACE_LIBRARY)) ||
                   ((TVar14 == UNKNOWN_LIBRARY && (bVar3 = cmTarget::IsImported(pcVar12), bVar3))))
                {
                  bVar3 = cmTarget::IsImported(pcVar12);
                  if ((!bVar3) || (bVar3 = cmTarget::IsImportedGloballyVisible(pcVar12), bVar3)) {
                    cmMakefile::AddAlias(this_00->Makefile,name,name_00);
                    return true;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"cannot create ALIAS target \"",0x1c);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1b0,(name->_M_dataplus)._M_p,
                                       name->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"\" because target \"",0x12);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(name_00->_M_dataplus)._M_p,name_00->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"\" is imported but not globally visible.",0x27);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_218);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,"cannot create ALIAS target \"",0x1c);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1b0,(name->_M_dataplus)._M_p,
                                       name->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"\" because target \"",0x12);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(name_00->_M_dataplus)._M_p,name_00->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"\" is not a library.",0x13);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_218);
                }
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ALIAS requires exactly one target argument.",0x2b);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(this_00,&local_218);
          }
          goto LAB_00296412;
        }
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"IMPORTED with ALIAS is not allowed.","");
        cmCommand::SetError(this_00,(string *)local_1b0);
      }
      else {
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
        cmCommand::SetError(this_00,(string *)local_1b0);
      }
      goto LAB_00296479;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   "Invalid name for ALIAS: ",name);
    cmCommand::SetError(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1b0);
  }
  if ((undefined1 *)local_1b0._0_8_ == local_1b0 + 0x10) {
    return false;
  }
LAB_00296483:
  operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  return false;
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !this->Makefile->CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName
        << "\" does not already "
           "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  cmAppend(srclists, s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}